

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall
fasttext::Dictionary::computeNgrams
          (Dictionary *this,string *word,vector<int,_std::allocator<int>_> *ngrams,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *subngram,
          subentry *sublemma,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *submorph,
          vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *subipangram)

{
  element_type *peVar1;
  bool bVar2;
  uint32_t uVar3;
  iterator iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  pointer pbVar8;
  char cVar9;
  Dictionary *pDVar10;
  ulong uVar11;
  pointer pbVar12;
  ulong uVar13;
  long lVar14;
  subentry e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  morphValues;
  string val;
  string charn;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propsValues;
  string prop;
  string value;
  
  utils::split(&propsValues,word,'~');
  uVar5 = 0;
  while( true ) {
    if ((ulong)((long)propsValues.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)propsValues.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar5) break;
    std::__cxx11::string::string
              ((string *)&value,
               (string *)
               (propsValues.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar5));
    cVar9 = (char)&value;
    std::__cxx11::string::find(cVar9,0x3a);
    std::__cxx11::string::substr((ulong)&prop,(ulong)&value);
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->props)._M_h,(key_type *)&prop);
    if (iVar4.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &prop,"w");
      if (bVar2) {
        std::__cxx11::string::find(cVar9,0x3a);
        std::__cxx11::string::substr((ulong)&morphValues,(ulong)&value);
        std::operator+(&e.subword,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       BOW_abi_cxx11_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &morphValues);
        std::operator+(&val,&e.subword,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       EOW_abi_cxx11_);
        std::__cxx11::string::~string((string *)&e);
        std::__cxx11::string::~string((string *)&morphValues);
        for (uVar7 = 0; uVar7 < val._M_string_length; uVar7 = uVar7 + 1) {
          morphValues.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&morphValues.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          morphValues.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          morphValues.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          uVar11 = uVar7;
          for (uVar13 = 1;
              (uVar11 < val._M_string_length &&
              (uVar13 <= (ulong)(long)((this->args_).
                                       super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->maxn)); uVar13 = uVar13 + 1) {
            pDVar10 = (Dictionary *)&morphValues;
            std::__cxx11::string::push_back((char)(Dictionary *)&morphValues);
            uVar11 = uVar11 + 1;
            peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((ulong)(long)peVar1->minn <= uVar13) {
              if ((uVar13 != 1) || (uVar7 != 0 && uVar11 != val._M_string_length)) {
                uVar3 = hash(pDVar10,(string *)&morphValues);
                uVar6 = uVar3 % (uint)peVar1->bucket;
                e.subword._M_dataplus._M_p._0_4_ = this->nwords_ + uVar6;
                std::vector<int,_std::allocator<int>_>::emplace_back<int>(ngrams,(int *)&e);
                e.subword._M_dataplus._M_p = (pointer)&e.subword.field_2;
                e.subword._M_string_length = 0;
                e.subword.field_2._M_local_buf[0] = '\0';
                std::__cxx11::string::_M_assign((string *)&e);
                e.id = (long)(int)uVar6 + (long)this->nwords_;
                std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::push_back
                          (subngram,&e);
                std::__cxx11::string::~string((string *)&e);
              }
            }
          }
          std::__cxx11::string::~string((string *)&morphValues);
        }
        std::__cxx11::string::~string((string *)&val);
      }
      else {
        std::__cxx11::string::find(cVar9,0x3a);
        std::__cxx11::string::substr((ulong)&val,(ulong)&value);
        pDVar10 = (Dictionary *)&prop;
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&prop,"l");
        if (bVar2) {
          uVar3 = hash(pDVar10,&value);
          uVar6 = uVar3 % (uint)((this->args_).
                                 super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->bucket;
          sublemma->id = (long)(int)uVar6 + (long)this->nwords_;
          std::__cxx11::string::_M_assign((string *)sublemma);
          e.subword._M_dataplus._M_p._0_4_ = uVar6 + this->nwords_;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(ngrams,(int *)&e);
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&prop,"m");
        if (bVar2) {
          pDVar10 = (Dictionary *)&morphValues;
          utils::split(&morphValues,&val,'+');
          lVar14 = 0;
          for (uVar7 = 0;
              uVar7 < (ulong)((long)morphValues.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)morphValues.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
              uVar7 = uVar7 + 1) {
            uVar3 = hash(pDVar10,(string *)
                                 ((long)&((morphValues.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar14));
            uVar6 = uVar3 % (uint)((this->args_).
                                   super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->bucket;
            e.subword._M_dataplus._M_p = (pointer)&e.subword.field_2;
            e.subword._M_string_length = 0;
            e.subword.field_2._M_local_buf[0] = '\0';
            e.id = (long)(int)uVar6 + (long)this->nwords_;
            pDVar10 = (Dictionary *)&e;
            std::__cxx11::string::_M_assign((string *)pDVar10);
            std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::push_back
                      (submorph,(value_type *)pDVar10);
            charn._M_dataplus._M_p._0_4_ = uVar6 + this->nwords_;
            std::vector<int,_std::allocator<int>_>::emplace_back<int>(ngrams,(int *)&charn);
            std::__cxx11::string::~string((string *)pDVar10);
            lVar14 = lVar14 + 0x20;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&morphValues);
        }
        bVar2 = std::operator==(&prop,"ipa");
        if (bVar2) {
          std::__cxx11::string::find((char)&value,0x3a);
          std::__cxx11::string::substr((ulong)&charn,(ulong)&value);
          std::operator+(&e.subword,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         BOW_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&charn
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &morphValues,&e.subword,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         EOW_abi_cxx11_);
          std::__cxx11::string::~string((string *)&e);
          std::__cxx11::string::~string((string *)&charn);
          for (pbVar12 = (pointer)0x0;
              pbVar12 < morphValues.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pbVar12 = (pointer)((long)&(pbVar12->_M_dataplus)._M_p + 1)) {
            charn._M_dataplus._M_p = (pointer)&charn.field_2;
            charn._M_string_length = 0;
            charn.field_2._M_local_buf[0] = '\0';
            pbVar8 = pbVar12;
            for (uVar7 = 1;
                (pbVar8 < morphValues.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish &&
                (uVar7 <= (ulong)(long)((this->args_).
                                        super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->maxn)); uVar7 = uVar7 + 1) {
              pDVar10 = (Dictionary *)&charn;
              std::__cxx11::string::push_back((char)(Dictionary *)&charn);
              pbVar8 = (pointer)((long)&(pbVar8->_M_dataplus)._M_p + 1);
              peVar1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if ((ulong)(long)peVar1->minn <= uVar7) {
                if ((uVar7 != 1) ||
                   (pbVar12 != (pointer)0x0 &&
                    pbVar8 != morphValues.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish)) {
                  uVar3 = hash(pDVar10,&charn);
                  uVar6 = uVar3 % (uint)peVar1->bucket;
                  e.subword._M_dataplus._M_p._0_4_ = this->nwords_ + uVar6;
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>(ngrams,(int *)&e);
                  e.subword._M_dataplus._M_p = (pointer)&e.subword.field_2;
                  e.subword._M_string_length = 0;
                  e.subword.field_2._M_local_buf[0] = '\0';
                  std::__cxx11::string::_M_assign((string *)&e);
                  e.id = (long)(int)uVar6 + (long)this->nwords_;
                  std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::push_back
                            (subipangram,&e);
                  std::__cxx11::string::~string((string *)&e);
                }
              }
            }
            std::__cxx11::string::~string((string *)&charn);
          }
          std::__cxx11::string::~string((string *)&morphValues);
        }
        std::__cxx11::string::~string((string *)&val);
      }
    }
    std::__cxx11::string::~string((string *)&prop);
    std::__cxx11::string::~string((string *)&value);
    uVar5 = uVar5 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&propsValues);
  return;
}

Assistant:

void Dictionary::computeNgrams(const std::string& word,
                               std::vector<int32_t>& ngrams,
			      std::vector<subentry>& subngram,
	                      subentry& sublemma,
                              std::vector<subentry>& submorph,
			      std::vector<subentry>& subipangram) const {
  //char x;
  std::vector<std::string> propsValues = utils::split(word, '~');
  for (size_t i = 0; i < propsValues.size(); i++) {
    std::string value = propsValues[i];
	std::string prop = value.substr(0, value.find(PROP_VALUE_SEP));
  const bool useProp = args_->props.find(prop) != args_->props.end();
	if (useProp) {
	   if(prop == "w"){

        // If only whole word  uncomment next two lines and comment rest code in the if loop
		/*int32_t h = hash(value) % args_->bucket;
		ngrams.push_back(nwords_ + h);*/

       // Default consider character-ngrams
	   std::string temp_word = BOW + value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos) + EOW;
	   for (size_t i = 0; i < temp_word.size(); i++) {
            std::string charn;
            if ((temp_word[i] & 0xC0) == 0x80) continue;
            for (size_t j = i, n = 1; j < temp_word.size() && n <= args_->maxn; n++) {
              charn.push_back(temp_word[j++]);
              while (j < temp_word.size() && (temp_word[j] & 0xC0) == 0x80) {
                charn.push_back(temp_word[j++]);
              }
              if (n >= args_->minn && !(n == 1 && (i == 0 || j == temp_word.size()))) {
                int32_t h = hash(charn) % args_->bucket;
                ngrams.push_back(nwords_ + h);
		        subentry e;
		        e.subword = charn;
		        e.id = nwords_+h;
		        subngram.push_back(e);
              }
            }
          }
	}
	else{
         std::string val = value.substr(value.find(PROP_VALUE_SEP)+1, std::string::npos);
         if(prop == "l"){
	  	    int32_t h = hash(value) % args_->bucket;
            sublemma.id = nwords_+h;
		    sublemma.subword = value;
	        ngrams.push_back(nwords_ + h);
	      }
	    if(prop == "m"){
            //Default encodes each morph tag separately
		    std::vector<std::string> morphValues = utils::split(val, '+');

		    for(int32_t m=0;m<morphValues.size();m++){
			    int32_t h = hash( morphValues[m]) % args_->bucket;
			    subentry e;
			    e.id = nwords_+h;
			    e.subword =  morphValues[m];
			    submorph.push_back(e);
	   		    ngrams.push_back(nwords_ + h);
		    }

          //Encodes the morphology tags as a whole
		  /*subentry e;
		  std::string val = value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos);
		  if(value=="")
		  { value = "m:<unk>";}
		  int32_t h = hash(value) % args_->bucket;
		  e.id = nwords_+h;
		  e.subword = value;
		  submorph.push_back(e);
		  ngrams.push_back(nwords_+h);*/
	    }

        if(prop == "ipa"){
	
	      std::string temp_word = BOW + value.substr(value.find(PROP_VALUE_SEP)+1,std::string::npos) + EOW;
	      for (size_t i = 0; i < temp_word.size(); i++) {
                std::string charn;
                if ((temp_word[i] & 0xC0) == 0x80) continue;
                for (size_t j = i, n = 1; j < temp_word.size() && n <= args_->maxn; n++) {
                    charn.push_back(temp_word[j++]);
                    while (j < temp_word.size() && (temp_word[j] & 0xC0) == 0x80) {
                    charn.push_back(temp_word[j++]);
                 }
              if (n >= args_->minn && !(n == 1 && (i == 0 || j == temp_word.size()))) {
                int32_t h = hash(charn) % args_->bucket;
                ngrams.push_back(nwords_ + h);
		        subentry e;
		        e.subword = charn;
		        e.id = nwords_+h;
		        subipangram.push_back(e);
              }
            }
          }
	    }
	  }
	}
  }
}